

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O2

void rsg::computeUniformValues
               (Random *rnd,vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *values,
               vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> *uniforms
               )

{
  ShaderInput *pSVar1;
  pointer pVVar2;
  ConstStridedValueAccess<1> dst;
  ConstValueRangeAccess valueRange;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer ppSVar5;
  VariableValue local_50;
  
  for (ppSVar5 = (uniforms->
                 super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppSVar5 !=
      (uniforms->
      super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>).
      _M_impl.super__Vector_impl_data._M_finish; ppSVar5 = ppSVar5 + 1) {
    pSVar1 = *ppSVar5;
    VariableValue::VariableValue(&local_50,pSVar1->m_variable);
    std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::
    emplace_back<rsg::VariableValue>(values,&local_50);
    std::_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>::~_Vector_base
              ((_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)&local_50.m_storage);
    pVVar2 = (values->super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    dst.m_type = &(pVVar2[-1].m_variable)->m_type;
    dst.m_value = pVVar2[-1].m_storage.m_value.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar3 = pSVar1->m_variable;
    uVar4 = (pSVar1->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start;
    valueRange.m_min = (Scalar *)uVar4;
    valueRange.m_type = (VariableType *)uVar3;
    valueRange.m_max =
         (pSVar1->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
         super__Vector_impl_data._M_start;
    computeRandomValue(rnd,(ValueAccess)dst,valueRange);
  }
  return;
}

Assistant:

void computeUniformValues (de::Random& rnd, std::vector<VariableValue>& values, const std::vector<const ShaderInput*>& uniforms)
{
	DE_ASSERT(values.empty());
	for (vector<const ShaderInput*>::const_iterator i = uniforms.begin(); i != uniforms.end(); i++)
	{
		const ShaderInput* uniform = *i;
		values.push_back(VariableValue(uniform->getVariable()));
		computeRandomValue(rnd, values[values.size()-1].getValue(), uniform->getValueRange());
	}
}